

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O1

bool __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::parse<unsigned_long,cmake*>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *this,string *input,
          unsigned_long *index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *allArgs,cmake **state)

{
  ulong uVar1;
  unsigned_long uVar2;
  pointer pcVar3;
  unsigned_long *puVar4;
  byte bVar5;
  pointer pbVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  long lVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  ParseMode parseState;
  string buffer;
  string value;
  ParseMode local_cc;
  string local_c8;
  string local_a8;
  undefined1 *local_88;
  pointer local_80;
  undefined8 local_78;
  undefined8 local_70;
  ulong local_68;
  unsigned_long *local_60;
  cmake **local_58;
  string local_50;
  
  local_cc = 0;
  switch(*(int *)(this + 0x60)) {
  case 0:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) {
      local_cc = 2;
      goto switchD_002adfbb_default;
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity =
         (ulong)(uint7)local_a8.field_2._M_allocated_capacity._1_7_ << 8;
    local_c8._M_dataplus._M_p = (pointer)*state;
    if (*(long *)(this + 0x78) == 0) {
      std::__throw_bad_function_call();
    }
    bVar5 = (**(code **)(this + 0x80))(this + 0x68,&local_a8,&local_c8);
    goto LAB_002ae246;
  case 1:
  case 3:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                (&local_a8,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,input,&local_cc);
      if (local_cc == 0) {
        local_c8._M_dataplus._M_p = (pointer)*state;
        if (*(long *)(this + 0x78) == 0) {
          std::__throw_bad_function_call();
        }
        bVar5 = (**(code **)(this + 0x80))(this + 0x68,&local_a8,&local_c8);
LAB_002ae34b:
        local_cc = (ParseMode)(bVar5 ^ 1);
      }
      goto LAB_002ae354;
    }
    uVar9 = *index + 1;
    pbVar6 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((uVar9 < (ulong)((long)(allArgs->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5)) &&
       (*pbVar6[uVar9]._M_dataplus._M_p != '-')) {
      local_a8._M_dataplus._M_p = (pointer)*state;
      if (*(long *)(this + 0x78) == 0) {
        std::__throw_bad_function_call();
      }
      bVar5 = (**(code **)(this + 0x80))(this + 0x68,pbVar6 + uVar9,&local_a8);
      local_cc = (ParseMode)(bVar5 ^ 1);
      *index = uVar9;
      goto switchD_002adfbb_default;
    }
    if (*(int *)(this + 0x60) != 3) goto LAB_002ae2ae;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity =
         (ulong)(uint7)local_a8.field_2._M_allocated_capacity._1_7_ << 8;
    local_c8._M_dataplus._M_p = (pointer)*state;
    if (*(long *)(this + 0x78) == 0) {
      std::__throw_bad_function_call();
    }
    bVar5 = (**(code **)(this + 0x80))(this + 0x68,&local_a8,&local_c8);
LAB_002ae246:
    local_cc = (ParseMode)(bVar5 ^ 1);
    uVar7 = local_a8.field_2._M_allocated_capacity;
    _Var8._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto switchD_002adfbb_default;
    break;
  case 2:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) goto switchD_002adfbb_default;
    uVar2 = *index;
    uVar9 = uVar2 + 2;
    pbVar6 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((((ulong)((long)(allArgs->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5) <= uVar9)
        || (*pbVar6[uVar2 + 1]._M_dataplus._M_p == '-')) || (*pbVar6[uVar9]._M_dataplus._M_p == '-')
       ) goto LAB_002ae2ae;
    *index = uVar9;
    local_a8._M_string_length = (size_type)pbVar6[uVar2 + 1]._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)pbVar6[uVar2 + 1]._M_string_length;
    local_a8.field_2._M_allocated_capacity = (size_type)&DAT_00000001;
    local_a8.field_2._8_8_ = (long)":/\\;" + 3;
    local_80 = pbVar6[uVar9]._M_dataplus._M_p;
    local_88 = (undefined1 *)pbVar6[uVar9]._M_string_length;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_a8;
    cmCatViews_abi_cxx11_(&local_c8,views_00);
    local_a8._M_dataplus._M_p = (pointer)*state;
    if (*(long *)(this + 0x78) == 0) {
      std::__throw_bad_function_call();
    }
    bVar5 = (**(code **)(this + 0x80))(this + 0x68,&local_c8,&local_a8);
LAB_002ae44e:
    local_cc = (ParseMode)(bVar5 ^ 1);
    uVar7 = local_c8.field_2._M_allocated_capacity;
    _Var8._M_p = local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto switchD_002adfbb_default;
    break;
  case 4:
    if (input->_M_string_length == *(size_type *)(this + 0x48)) {
      uVar2 = *index;
      uVar9 = uVar2 + 1;
      pbVar6 = (allArgs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((uVar9 < (ulong)((long)(allArgs->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5))
         && (*pbVar6[uVar9]._M_dataplus._M_p != '-')) {
        uVar1 = uVar2 + 2;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        pcVar3 = pbVar6[uVar9]._M_dataplus._M_p;
        local_60 = index;
        local_58 = state;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar3,pcVar3 + pbVar6[uVar9]._M_string_length);
        pbVar6 = (allArgs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_68 = uVar1;
        if (uVar1 < (ulong)((long)(allArgs->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5))
        {
          lVar10 = uVar2 * 0x20 + 0x40;
          do {
            if (**(char **)((long)&(pbVar6->_M_dataplus)._M_p + lVar10) == '-') break;
            local_a8._M_dataplus._M_p = (pointer)local_c8._M_string_length;
            local_a8._M_string_length = (size_type)local_c8._M_dataplus._M_p;
            local_a8.field_2._M_allocated_capacity = (size_type)&DAT_00000001;
            local_a8.field_2._8_8_ = (long)":/\\;" + 3;
            local_80 = *(pointer *)((long)&(pbVar6->_M_dataplus)._M_p + lVar10);
            local_88 = *(undefined1 **)((long)&pbVar6->_M_string_length + lVar10);
            views._M_len = 3;
            views._M_array = (iterator)&local_a8;
            cmCatViews_abi_cxx11_(&local_50,views);
            std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._0_8_ + 1);
            }
            local_68 = local_68 + 1;
            pbVar6 = (allArgs->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar10 = lVar10 + 0x20;
          } while (local_68 <
                   (ulong)((long)(allArgs->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5));
        }
        puVar4 = local_60;
        local_a8._M_dataplus._M_p = (pointer)*local_58;
        if (*(long *)(this + 0x78) == 0) {
          std::__throw_bad_function_call();
        }
        bVar5 = (**(code **)(this + 0x80))(this + 0x68,&local_c8,&local_a8);
        *puVar4 = local_68 - 1;
        goto LAB_002ae44e;
      }
LAB_002ae2ae:
      local_cc = 3;
      goto switchD_002adfbb_default;
    }
    cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
    ::extract_single_value
              (&local_a8,
               (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                *)this,input,&local_cc);
    if (local_cc == 0) {
      local_c8._M_dataplus._M_p = (pointer)*state;
      if (*(long *)(this + 0x78) == 0) {
        std::__throw_bad_function_call();
      }
      bVar5 = (**(code **)(this + 0x80))(this + 0x68,&local_a8,&local_c8);
      goto LAB_002ae34b;
    }
LAB_002ae354:
    uVar7 = local_a8.field_2._M_allocated_capacity;
    _Var8._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto switchD_002adfbb_default;
    break;
  default:
    goto switchD_002adfbb_default;
  }
  operator_delete(_Var8._M_p,(ulong)(uVar7 + 1));
switchD_002adfbb_default:
  if (local_cc == 3) {
    cmSystemTools::Error((string *)(this + 0x20));
  }
  else if (local_cc == 2) {
    local_a8.field_2._8_8_ = (input->_M_dataplus)._M_p;
    local_a8.field_2._M_allocated_capacity = input->_M_string_length;
    local_a8._M_dataplus._M_p = &DAT_00000001;
    local_a8._M_string_length = 0x72bf68;
    local_88 = &DAT_00000001;
    local_80 = "\'";
    local_70 = *(undefined8 *)this;
    local_78 = *(undefined8 *)(this + 8);
    views_01._M_len = 4;
    views_01._M_array = (iterator)&local_a8;
    cmCatViews_abi_cxx11_(&local_c8,views_01);
    cmSystemTools::Error(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  return local_cc == 0;
}

Assistant:

bool parse(std::string const& input, T& index,
             std::vector<std::string> const& allArgs,
             CallState&&... state) const
  {
    ParseMode parseState = ParseMode::Valid;

    if (this->Type == Values::Zero) {
      if (input.size() == this->Name.size()) {
        parseState =
          this->StoreCall(std::string{}, std::forward<CallState>(state)...)
          ? ParseMode::Valid
          : ParseMode::Invalid;
      } else {
        parseState = ParseMode::SyntaxError;
      }

    } else if (this->Type == Values::One || this->Type == Values::ZeroOrOne) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          if (this->Type == Values::ZeroOrOne) {
            parseState =
              this->StoreCall(std::string{}, std::forward<CallState>(state)...)
              ? ParseMode::Valid
              : ParseMode::Invalid;
          } else {
            parseState = ParseMode::ValueError;
          }
        } else {
          parseState = this->StoreCall(allArgs[nextValueIndex],
                                       std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = nextValueIndex;
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::Two) {
      if (input.size() == this->Name.size()) {
        if (index + 2 >= allArgs.size() || allArgs[index + 1][0] == '-' ||
            allArgs[index + 2][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          index += 2;
          parseState =
            this->StoreCall(cmStrCat(allArgs[index - 1], ";", allArgs[index]),
                            std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::OneOrMore) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          std::string buffer = allArgs[nextValueIndex++];
          while (nextValueIndex < allArgs.size() &&
                 allArgs[nextValueIndex][0] != '-') {
            buffer = cmStrCat(buffer, ";", allArgs[nextValueIndex++]);
          }
          parseState =
            this->StoreCall(buffer, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = (nextValueIndex - 1);
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    }

    if (parseState == ParseMode::SyntaxError) {
      cmSystemTools::Error(
        cmStrCat("'", input, "'", this->InvalidSyntaxMessage));
    } else if (parseState == ParseMode::ValueError) {
      cmSystemTools::Error(this->InvalidValueMessage);
    }
    return (parseState == ParseMode::Valid);
  }